

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

void __thiscall VertexBuffer::~VertexBuffer(VertexBuffer *this)

{
  pointer pBVar1;
  
  (*glad_glDeleteBuffers)(1,&this->m_id);
  pBVar1 = (this->m_layout).elements.
           super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1,(long)(this->m_layout).elements.
                                 super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar1);
    return;
  }
  return;
}

Assistant:

VertexBuffer::~VertexBuffer()
{
    glDeleteBuffers(1, &m_id);
}